

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

Point2f __thiscall pbrt::StratifiedSampler::Get2D(StratifiedSampler *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t i;
  uint32_t l;
  BasicOptions *pBVar4;
  uint64_t uVar5;
  StratifiedSampler *in_RDI;
  float fVar6;
  float fVar7;
  Float dy;
  Float dx;
  int y;
  int x;
  int stratum;
  uint64_t hash;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Tuple2<pbrt::Point2,_float> local_8;
  
  iVar1 = (in_RDI->pixel).super_Tuple2<pbrt::Point2,_int>.x;
  iVar2 = (in_RDI->pixel).super_Tuple2<pbrt::Point2,_int>.y;
  iVar3 = in_RDI->dimension;
  pBVar4 = GetOptions();
  uVar5 = MixBits((long)iVar1 << 0x30 ^ (long)iVar2 << 0x20 ^ (long)iVar3 << 0x10 ^
                  (long)pBVar4->seed);
  in_RDI->dimension = in_RDI->dimension + 2;
  i = in_RDI->sampleIndex;
  l = SamplesPerPixel(in_RDI);
  PermutationElement(i,l,(uint32_t)uVar5);
  if ((in_RDI->jitter & 1U) == 0) {
    fVar6 = 0.5;
  }
  else {
    fVar6 = RNG::Uniform<float>((RNG *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                               );
  }
  if ((in_RDI->jitter & 1U) == 0) {
    fVar7 = 0.5;
  }
  else {
    fVar7 = RNG::Uniform<float>((RNG *)CONCAT44(fVar6,in_stack_ffffffffffffffb0));
  }
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(fVar6,fVar7),in_stack_ffffffffffffffac,
             in_stack_ffffffffffffffa8);
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);
        dimension += 2;

        int stratum = PermutationElement(sampleIndex, SamplesPerPixel(), hash);
        int x = stratum % xPixelSamples;
        int y = stratum / xPixelSamples;
        Float dx = jitter ? rng.Uniform<Float>() : 0.5f;
        Float dy = jitter ? rng.Uniform<Float>() : 0.5f;
        return {(x + dx) / xPixelSamples, (y + dy) / yPixelSamples};
    }